

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateRegistrationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *in_RDX;
  string_view text;
  string local_38;
  
  UnderscoresToCamelCaseCheckReserved_abi_cxx11_(&local_38,(java *)this->descriptor_,in_RDX);
  text._M_str = "registry.add($scope$.$name$);\n";
  text._M_len = 0x1e;
  io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,text,(char (*) [6])0x667118,&this->scope_,(char (*) [5])0x7203be,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return 7;
}

Assistant:

int ImmutableExtensionGenerator::GenerateRegistrationCode(
    io::Printer* printer) {
  printer->Print("registry.add($scope$.$name$);\n", "scope", scope_, "name",
                 UnderscoresToCamelCaseCheckReserved(descriptor_));
  return 7;
}